

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search_fwdtree.c
# Opt level: O1

void init_search_tree(ngram_search_t *ngs)

{
  short sVar1;
  uint uVar2;
  dict_t *d;
  short *psVar3;
  dictword_t *pdVar4;
  bin_mdef_t *pbVar5;
  mdef_entry_t *pmVar6;
  int iVar7;
  int iVar8;
  int32 *piVar9;
  void *ptr;
  root_chan_t *prVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  size_t sVar17;
  long lVar18;
  size_t n_elem;
  uint local_38;
  
  d = (ngs->base).dict;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
          ,0x49,"Initializing search tree\n");
  iVar16 = (ngs->base).n_words;
  n_elem = (size_t)iVar16;
  piVar9 = (int32 *)__ckd_calloc__(n_elem,4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                   ,0x4c);
  ngs->homophone_set = piVar9;
  ngs->n_1ph_words = 0;
  iVar8 = ((ngs->base).acmod)->mdef->n_ciphone;
  local_38 = 0;
  ptr = __ckd_calloc__((ulong)(iVar8 * iVar8 + 0x1fU >> 5),4,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                       ,0x53);
  if (0 < (long)n_elem) {
    sVar17 = 0;
    lVar13 = 0x10;
    local_38 = 0;
    do {
      iVar7 = dict_real_word(d,(s3wid_t)sVar17);
      if (iVar7 != 0) {
        if (*(int *)((long)&d->word->word + lVar13) == 1) {
          ngs->n_1ph_words = ngs->n_1ph_words + 1;
        }
        else {
          psVar3 = *(short **)((long)d->word + lVar13 + -8);
          iVar7 = (int)psVar3[1];
          iVar11 = *psVar3 * iVar8;
          uVar15 = iVar11 + iVar7;
          uVar12 = iVar11 + iVar7 + 0x1f;
          if (-1 < (int)uVar15) {
            uVar12 = uVar15;
          }
          uVar2 = *(uint *)((long)ptr + (long)((int)uVar12 >> 5) * 4);
          if ((uVar2 >> (uVar15 & 0x1f) & 1) == 0) {
            *(uint *)((long)ptr + (long)((int)uVar12 >> 5) * 4) =
                 uVar2 | (uint)(1L << ((byte)uVar15 & 0x1f));
            local_38 = local_38 + 1;
          }
        }
      }
      sVar17 = sVar17 + 1;
      lVar13 = lVar13 + 0x20;
    } while (n_elem != sVar17);
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
          ,100,"%d unique initial diphones\n",(ulong)local_38);
  ckd_free(ptr);
  ngs->n_1ph_words = (d->filler_end - d->filler_start) + ngs->n_1ph_words + 2;
  ngs->n_root_chan_alloc = local_38 + 1;
  if (0 < iVar16) {
    lVar13 = 0x10;
    uVar14 = 0;
    do {
      iVar8 = dict_real_word(d,(s3wid_t)uVar14);
      if ((iVar8 == 0) && (*(int *)((long)&d->word->word + lVar13) != 1)) {
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                ,0x71,"Filler word %d = %s has more than one phone, ignoring it.\n",
                uVar14 & 0xffffffff,*(undefined8 *)((long)d->word + lVar13 + -0x10));
        ngs->n_1ph_words = ngs->n_1ph_words + -1;
      }
      uVar14 = uVar14 + 1;
      lVar13 = lVar13 + 0x20;
    } while (n_elem != uVar14);
  }
  prVar10 = (root_chan_t *)
            __ckd_calloc__((long)ngs->n_root_chan_alloc,0x70,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                           ,0x78);
  ngs->root_chan = prVar10;
  if (0 < ngs->n_root_chan_alloc) {
    lVar13 = 0;
    lVar18 = 0;
    do {
      hmm_init(ngs->hmmctx,(hmm_t *)((long)(ngs->root_chan->hmm).score + lVar13 + -8),1,-1,-1);
      prVar10 = ngs->root_chan;
      *(undefined4 *)((long)(&prVar10->hmm + 1) + lVar13 + 8) = 0xffffffff;
      *(undefined8 *)((long)(&prVar10->hmm + 1) + lVar13) = 0;
      lVar18 = lVar18 + 1;
      lVar13 = lVar13 + 0x70;
    } while (lVar18 < ngs->n_root_chan_alloc);
  }
  prVar10 = (root_chan_t *)
            __ckd_calloc__((long)ngs->n_1ph_words,0x70,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                           ,0x81);
  ngs->rhmm_1ph = prVar10;
  if (0 < iVar16) {
    lVar13 = 0;
    iVar16 = 0;
    do {
      pdVar4 = d->word;
      if ((&pdVar4->pronlen)[lVar13] == 1) {
        prVar10 = ngs->rhmm_1ph;
        pbVar5 = ((ngs->base).acmod)->mdef;
        prVar10[iVar16].ci2phone = (int16)pbVar5->sil;
        sVar1 = **(short **)((long)&pdVar4->ciphone + lVar13 * 4);
        prVar10[iVar16].ciphone = sVar1;
        pmVar6 = pbVar5->phone;
        hmm_init(ngs->hmmctx,&prVar10[iVar16].hmm,1,pmVar6[sVar1].ssid,pmVar6[sVar1].tmat);
        prVar10 = ngs->rhmm_1ph;
        prVar10[iVar16].next = (chan_t *)0x0;
        *(root_chan_t **)((long)ngs->word_chan + lVar13) = prVar10 + iVar16;
        iVar16 = iVar16 + 1;
      }
      lVar13 = lVar13 + 8;
    } while (n_elem * 8 != lVar13);
  }
  piVar9 = (int32 *)__ckd_calloc__((long)ngs->n_1ph_words,4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                   ,0x93);
  ngs->single_phone_wid = piVar9;
  return;
}

Assistant:

static void
init_search_tree(ngram_search_t *ngs)
{
    int32 w, ndiph, i, n_words, n_ci;
    dict_t *dict = ps_search_dict(ngs);
    bitvec_t *dimap;

    E_INFO("Initializing search tree\n");

    n_words = ps_search_n_words(ngs);
    ngs->homophone_set = ckd_calloc(n_words, sizeof(*ngs->homophone_set));

    /* Find #single phone words, and #unique first diphones (#root channels) in dict. */
    ndiph = 0;
    ngs->n_1ph_words = 0;
    n_ci = bin_mdef_n_ciphone(ps_search_acmod(ngs)->mdef);
    /* Allocate a bitvector with flags for each possible diphone. */
    dimap = bitvec_alloc(n_ci * n_ci);
    for (w = 0; w < n_words; w++) {
        if (!dict_real_word(dict, w))
            continue;
        if (dict_is_single_phone(dict, w))
            ++ngs->n_1ph_words;
        else {
            int ph0, ph1;
            ph0 = dict_first_phone(dict, w);
            ph1 = dict_second_phone(dict, w);
            /* Increment ndiph the first time we see a diphone. */
            if (bitvec_is_clear(dimap, ph0 * n_ci + ph1)) {
                bitvec_set(dimap, ph0 * n_ci + ph1);
                ++ndiph;
            }
        }
    }
    E_INFO("%d unique initial diphones\n", ndiph);
    bitvec_free(dimap);

    /* Add remaining dict words (</s>, <s>, <sil>, noise words) to single-phone words */
    ngs->n_1ph_words += dict_num_fillers(dict) + 2;
    ngs->n_root_chan_alloc = ndiph + 1;
    /* Verify that these are all *actually* single-phone words,
     * otherwise really bad things will happen to us. */
    for (w = 0; w < n_words; ++w) {
        if (dict_real_word(dict, w))
            continue;
        if (!dict_is_single_phone(dict, w)) {
            E_WARN("Filler word %d = %s has more than one phone, ignoring it.\n",
                   w, dict_wordstr(dict, w));
            --ngs->n_1ph_words;
        }
    }

    /* Allocate and initialize root channels */
    ngs->root_chan =
        ckd_calloc(ngs->n_root_chan_alloc, sizeof(*ngs->root_chan));
    for (i = 0; i < ngs->n_root_chan_alloc; i++) {
        hmm_init(ngs->hmmctx, &ngs->root_chan[i].hmm, TRUE, -1, -1);
        ngs->root_chan[i].penult_phn_wid = -1;
        ngs->root_chan[i].next = NULL;
    }

    /* Permanently allocate and initialize channels for single-phone
     * words (1/word). */
    ngs->rhmm_1ph = ckd_calloc(ngs->n_1ph_words, sizeof(*ngs->rhmm_1ph));
    i = 0;
    for (w = 0; w < n_words; w++) {
        if (!dict_is_single_phone(dict, w))
            continue;
        /* Use SIL as right context for these. */
        ngs->rhmm_1ph[i].ci2phone = bin_mdef_silphone(ps_search_acmod(ngs)->mdef);
        ngs->rhmm_1ph[i].ciphone = dict_first_phone(dict, w);
        hmm_init(ngs->hmmctx, &ngs->rhmm_1ph[i].hmm, TRUE,
                 bin_mdef_pid2ssid(ps_search_acmod(ngs)->mdef, ngs->rhmm_1ph[i].ciphone),
                 bin_mdef_pid2tmatid(ps_search_acmod(ngs)->mdef, ngs->rhmm_1ph[i].ciphone));
        ngs->rhmm_1ph[i].next = NULL;

        ngs->word_chan[w] = (chan_t *) &(ngs->rhmm_1ph[i]);
        i++;
    }

    ngs->single_phone_wid = ckd_calloc(ngs->n_1ph_words,
                                       sizeof(*ngs->single_phone_wid));
}